

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O1

ParameterSymbolBase * __thiscall
slang::ast::ParameterBuilder::createParam
          (ParameterBuilder *this,ParameterDecl *decl,Scope *newScope,SourceLocation instanceLoc)

{
  bitmask<slang::ast::DeclaredTypeFlags> *pbVar1;
  undefined1 *puVar2;
  char *pcVar3;
  group_type_pointer pgVar4;
  undefined4 uVar5;
  Compilation *compilation;
  size_t __n;
  ForwardTypeRestrictionSyntax *syntax;
  SyntaxNode *pSVar6;
  EqualsTypeClauseSyntax *pEVar7;
  HierarchyOverrideNode *pHVar8;
  group_type_pointer pgVar9;
  char *pcVar10;
  Scope *this_00;
  uint uVar11;
  undefined1 auVar12 [16];
  char cVar13;
  char cVar14;
  char cVar15;
  ulong uVar16;
  ulong uVar17;
  value_type *pvVar18;
  ulong uVar19;
  int iVar20;
  uint64_t uVar21;
  TypeParameterSymbol *param;
  NamedTypeSyntax *pNVar22;
  ParameterSymbol *this_01;
  ulong uVar23;
  ParameterDeclarationSyntax *pPVar24;
  SourceLocation SVar25;
  Diagnostic *this_02;
  ulong uVar26;
  char cVar27;
  uint uVar28;
  ParameterSymbolBase *pPVar29;
  ulong uVar30;
  value_type_pointer ppVar31;
  ASTContext *pAVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ParameterDecl *pPVar36;
  NameSyntax *nameSyntax;
  SyntaxNode *this_03;
  bool bVar37;
  uchar uVar38;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  ForwardTypeRestriction typeRestriction;
  ParameterDecl *local_130;
  char *local_128;
  basic_string_view<char,_std::char_traits<char>_> *local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  ulong local_f8;
  value_type *elements;
  anon_class_16_2_b10c6898 reportError;
  SourceLocation instanceLoc_local;
  undefined1 local_b8 [24];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  reportError.instanceLoc = &instanceLoc_local;
  compilation = this->scope->compilation;
  local_120 = &decl->name;
  reportError.this = this;
  instanceLoc_local = instanceLoc;
  uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &(this->assignments).super_Storage.field_0x108,local_120);
  uVar30 = uVar21 >> ((this->assignments).field_0x110 & 0x3f);
  lVar33 = *(long *)&(this->assignments).field_0x120;
  lVar35 = (uVar21 & 0xff) * 4;
  cVar27 = (&UNK_0046cabc)[lVar35];
  cVar13 = (&UNK_0046cabd)[lVar35];
  cVar14 = (&UNK_0046cabe)[lVar35];
  cVar15 = (&UNK_0046cabf)[lVar35];
  elements = *(value_type **)&(this->assignments).field_0x128;
  __n = (decl->name)._M_len;
  local_128 = (decl->name)._M_str;
  uVar26 = (ulong)((uint)uVar21 & 7);
  uVar23 = *(ulong *)&(this->assignments).field_0x118;
  uVar34 = 0;
  local_130 = decl;
  do {
    pvVar18 = elements;
    pcVar3 = (char *)(lVar33 + uVar30 * 0x10);
    auVar39[0] = -(*pcVar3 == cVar27);
    auVar39[1] = -(pcVar3[1] == cVar13);
    auVar39[2] = -(pcVar3[2] == cVar14);
    auVar39[3] = -(pcVar3[3] == cVar15);
    auVar39[4] = -(pcVar3[4] == cVar27);
    auVar39[5] = -(pcVar3[5] == cVar13);
    auVar39[6] = -(pcVar3[6] == cVar14);
    auVar39[7] = -(pcVar3[7] == cVar15);
    auVar39[8] = -(pcVar3[8] == cVar27);
    auVar39[9] = -(pcVar3[9] == cVar13);
    auVar39[10] = -(pcVar3[10] == cVar14);
    auVar39[0xb] = -(pcVar3[0xb] == cVar15);
    auVar39[0xc] = -(pcVar3[0xc] == cVar27);
    auVar39[0xd] = -(pcVar3[0xd] == cVar13);
    auVar39[0xe] = -(pcVar3[0xe] == cVar14);
    auVar39[0xf] = -(pcVar3[0xf] == cVar15);
    uVar19 = uVar30;
    uVar16 = local_118;
    uVar17 = local_100;
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe); local_118 = uVar34,
        local_100 = uVar19, uVar28 != 0; uVar28 = uVar28 - 1 & uVar28) {
      iVar20 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
        }
      }
      bVar37 = __n == *(size_t *)
                       ((long)&pvVar18[uVar30 * 0xf].first._M_len + (ulong)(uint)(iVar20 << 5));
      lVar35 = (long)&pvVar18[uVar30 * 0xf].first._M_len + (ulong)(uint)(iVar20 << 5);
      local_110 = uVar23;
      local_108 = lVar33;
      local_f8 = uVar26;
      if (bVar37 && __n != 0) {
        iVar20 = bcmp(local_128,*(void **)(lVar35 + 8),__n);
        bVar37 = iVar20 == 0;
      }
      if (bVar37) goto LAB_0014cc32;
      uVar26 = local_f8;
      uVar23 = local_110;
      uVar19 = local_100;
      lVar33 = local_108;
      uVar34 = local_118;
      uVar16 = local_118;
      uVar17 = local_100;
    }
    if ((*(byte *)(uVar30 * 0x10 + lVar33 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar26]) == 0) break;
    uVar34 = local_118 + 1;
    uVar30 = local_100 + local_118 + 1 & uVar23;
    local_118 = uVar16;
    local_100 = uVar17;
  } while (uVar34 <= uVar23);
  lVar35 = 0;
  local_118 = uVar16;
  local_100 = uVar17;
LAB_0014cc32:
  pPVar36 = local_130;
  if (lVar35 == 0) {
    pPVar29 = (ParameterSymbolBase *)0x0;
    this_03 = (SyntaxNode *)0x0;
  }
  else {
    this_03 = *(SyntaxNode **)(lVar35 + 0x10);
    pPVar29 = (ParameterSymbolBase *)CONCAT71((int7)(__n >> 8),*(undefined1 *)(lVar35 + 0x18));
  }
  cVar27 = (char)pPVar29;
  if (local_130->isTypeParam != true) {
    this_01 = BumpAllocator::
              emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&>
                        (&compilation->super_BumpAllocator,local_120,&local_130->location,
                         &local_130->isLocalParam,&local_130->isPortParam);
    Symbol::setAttributes((Symbol *)this_01,this->scope,pPVar36->attributes);
    if (pPVar36->hasSyntax == true) {
      (this_01->super_ParameterSymbolBase).defaultValSyntax = (SyntaxNode *)local_130->field_1;
      pPVar24 = (local_130->field_0).valueSyntax;
      pSVar6 = (pPVar24->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode;
      if (pSVar6 != (SyntaxNode *)0x0) {
        Scope::addMembers(newScope,pSVar6);
      }
      pSVar6 = (pPVar24->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent;
      if ((pSVar6->kind == ParameterDeclarationStatement) &&
         (pSVar6 = pSVar6->previewNode, pSVar6 != (SyntaxNode *)0x0)) {
        Scope::addMembers(newScope,pSVar6);
      }
    }
    if (this_03 != (SyntaxNode *)0x0) {
      pbVar1 = &(this_01->super_ValueSymbol).declaredType.flags;
      *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 4;
    }
    if (local_130->hasSyntax == false) {
      (this_01->super_ValueSymbol).declaredType.type = (local_130->field_0).givenType;
      if ((local_130->field_1).valueDecl != (DeclaratorSyntax *)0x0) {
        (this_01->super_ValueSymbol).declaredType.initializer =
             (Expression *)(local_130->field_1).valueDecl;
      }
    }
    else {
      (this_01->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)
           (((local_130->field_0).givenType)->super_Symbol).nextInScope;
      puVar2 = &(this_01->super_ValueSymbol).declaredType.field_0x3f;
      *puVar2 = *puVar2 & 0x7f;
      ValueSymbol::setFromDeclarator(&this_01->super_ValueSymbol,(local_130->field_1).valueDecl);
    }
    if (this_03 != (SyntaxNode *)0x0) {
      local_b8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_03);
      SVar25 = parsing::Token::location((Token *)local_b8);
      (this_01->super_ValueSymbol).declaredType.initializerSyntax = (ExpressionSyntax *)this_03;
      (this_01->super_ValueSymbol).declaredType.initializerLocation = SVar25;
    }
    Scope::insertMember(newScope,(Symbol *)this_01,newScope->lastMember,false,true);
    pSVar6 = (this_01->super_ValueSymbol).super_Symbol.originatingSyntax;
    pHVar8 = this->overrideNode;
    if ((pHVar8 == (HierarchyOverrideNode *)0x0 || ((ulong)pPVar29 & 1) != 0) ||
        pSVar6 == (SyntaxNode *)0x0) {
      bVar37 = true;
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = pSVar6;
      uVar26 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar23 = uVar26 >> ((byte)(pHVar8->paramOverrides).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar9 = (pHVar8->paramOverrides).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .arrays.groups_;
      uVar5 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar26 & 0xff];
      pcVar3 = (char *)0x0;
      do {
        local_128 = pcVar3;
        pgVar4 = pgVar9 + uVar23;
        uVar38 = (uchar)uVar5;
        auVar43[0] = -(pgVar4->m[0].n == uVar38);
        uVar40 = (uchar)((uint)uVar5 >> 8);
        auVar43[1] = -(pgVar4->m[1].n == uVar40);
        uVar41 = (uchar)((uint)uVar5 >> 0x10);
        auVar43[2] = -(pgVar4->m[2].n == uVar41);
        uVar42 = (uchar)((uint)uVar5 >> 0x18);
        auVar43[3] = -(pgVar4->m[3].n == uVar42);
        auVar43[4] = -(pgVar4->m[4].n == uVar38);
        auVar43[5] = -(pgVar4->m[5].n == uVar40);
        auVar43[6] = -(pgVar4->m[6].n == uVar41);
        auVar43[7] = -(pgVar4->m[7].n == uVar42);
        auVar43[8] = -(pgVar4->m[8].n == uVar38);
        auVar43[9] = -(pgVar4->m[9].n == uVar40);
        auVar43[10] = -(pgVar4->m[10].n == uVar41);
        auVar43[0xb] = -(pgVar4->m[0xb].n == uVar42);
        auVar43[0xc] = -(pgVar4->m[0xc].n == uVar38);
        auVar43[0xd] = -(pgVar4->m[0xd].n == uVar40);
        auVar43[0xe] = -(pgVar4->m[0xe].n == uVar41);
        auVar43[0xf] = -(pgVar4->m[0xf].n == uVar42);
        uVar28 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
        if (uVar28 != 0) {
          ppVar31 = (pHVar8->paramOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                    .arrays.elements_;
          do {
            uVar11 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            if (pSVar6 == ppVar31[uVar23 * 0xf + (ulong)uVar11].first) {
              ppVar31 = ppVar31 + uVar23 * 0xf + (ulong)uVar11;
              goto LAB_0014cf9f;
            }
            uVar28 = uVar28 - 1 & uVar28;
          } while (uVar28 != 0);
        }
        if ((pgVar9[uVar23].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar26 & 7]) == 0) {
          ppVar31 = (value_type_pointer)0x0;
          goto LAB_0014cf9f;
        }
        pcVar10 = (char *)(pHVar8->paramOverrides).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                          .arrays.groups_size_mask;
        uVar23 = (ulong)(local_128 + uVar23 + 1) & (ulong)pcVar10;
        pcVar3 = local_128 + 1;
      } while (local_128 + 1 <= pcVar10);
      ppVar31 = (value_type_pointer)0x0;
LAB_0014cf9f:
      bVar37 = ppVar31 == (value_type_pointer)0x0;
      if (!bVar37) {
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_58,
                          (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&ppVar31->second);
        ParameterSymbol::setValue(this_01,compilation,(ConstantValue *)&local_58,true);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        pPVar29 = &this_01->super_ParameterSymbolBase;
      }
    }
    if (!bVar37) {
      return pPVar29;
    }
    pPVar29 = &this_01->super_ParameterSymbolBase;
    if ((this_01->super_ParameterSymbolBase).isLocal != false) {
      return pPVar29;
    }
    if (this->forceInvalidValues == true) {
      local_80._M_index = '\0';
      ParameterSymbol::setValue(this_01,compilation,(ConstantValue *)&local_80,false);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_80);
      return pPVar29;
    }
    if (this_03 != (SyntaxNode *)0x0) {
      if (cVar27 == '\0') {
        pAVar32 = this->instanceContext;
        if (pAVar32 == (ASTContext *)0x0) {
          return pPVar29;
        }
      }
      else {
        this_01->isFromConf = true;
        pAVar32 = (ASTContext *)local_b8;
        local_b8._8_4_ = 0xffffffff;
        local_b8._0_8_ = this->configScope;
        local_b8._16_8_ = 0x10000000000;
        local_a0 = (undefined1  [16])0x0;
        local_90 = (undefined1  [16])0x0;
      }
      DeclaredType::resolveAt(&(this_01->super_ValueSymbol).declaredType,pAVar32);
      return pPVar29;
    }
    if ((this_01->super_ParameterSymbolBase).isPort != true) {
      return pPVar29;
    }
    if ((this_01->super_ValueSymbol).declaredType.initializerSyntax != (ExpressionSyntax *)0x0) {
      return pPVar29;
    }
    createParam(slang::ast::DefinitionSymbol::ParameterDecl_const&,slang::ast::Scope&,slang::SourceLocation)
    ::$_0::operator()((__0 *)&reportError,this_01);
    return pPVar29;
  }
  typeRestriction = None;
  if (((local_130->hasSyntax == true) &&
      ((local_130->field_0).typeSyntax != (TypeParameterDeclarationSyntax *)0x0)) &&
     (syntax = ((local_130->field_0).typeSyntax)->typeRestriction,
     syntax != (ForwardTypeRestrictionSyntax *)0x0)) {
    typeRestriction = SemanticFacts::getTypeRestriction(syntax);
  }
  param = BumpAllocator::
          emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&,slang::ast::ForwardTypeRestriction&>
                    (&compilation->super_BumpAllocator,newScope,local_120,&pPVar36->location,
                     &pPVar36->isLocalParam,&pPVar36->isPortParam,&typeRestriction);
  Symbol::setAttributes(&param->super_Symbol,this->scope,pPVar36->attributes);
  if (pPVar36->hasSyntax == true) {
    pPVar24 = (pPVar36->field_0).valueSyntax;
    pSVar6 = (pPVar24->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode;
    if (pSVar6 != (SyntaxNode *)0x0) {
      Scope::addMembers(newScope,pSVar6);
    }
    pSVar6 = (pPVar24->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent;
    if ((pSVar6->kind == ParameterDeclarationStatement) &&
       (pSVar6 = pSVar6->previewNode, pSVar6 != (SyntaxNode *)0x0)) {
      Scope::addMembers(newScope,pSVar6);
    }
    if (((pPVar36->field_1).typeDecl != (TypeAssignmentSyntax *)0x0) &&
       (pEVar7 = ((pPVar36->field_1).typeDecl)->assignment, pEVar7 != (EqualsTypeClauseSyntax *)0x0)
       ) {
      (param->super_ParameterSymbolBase).defaultValSyntax = (SyntaxNode *)(pEVar7->type).ptr;
    }
  }
  if (this_03 == (SyntaxNode *)0x0) {
    if (pPVar36->hasSyntax == false) {
      pPVar24 = (pPVar36->field_0).valueSyntax;
      if (pPVar24 == (ParameterDeclarationSyntax *)0x0) goto LAB_0014d06b;
    }
    else {
      (param->super_Symbol).originatingSyntax = (SyntaxNode *)pPVar36->field_1;
      pEVar7 = ((pPVar36->field_1).typeDecl)->assignment;
      if (pEVar7 != (EqualsTypeClauseSyntax *)0x0) {
        pNVar22 = (NamedTypeSyntax *)(pEVar7->type).ptr;
        goto LAB_0014cf8f;
      }
LAB_0014d06b:
      pPVar24 = (ParameterDeclarationSyntax *)compilation->errorType;
    }
    (param->targetType).type = (Type *)pPVar24;
  }
  else {
    pbVar1 = &(param->targetType).flags;
    *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 8;
    bVar37 = slang::syntax::NameSyntax::isKind(this_03->kind);
    if (bVar37) {
      pNVar22 = BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NameSyntax&>
                          (&compilation->super_BumpAllocator,(NameSyntax *)this_03);
LAB_0014cf8f:
      (param->targetType).typeOrLink.typeSyntax = &pNVar22->super_DataTypeSyntax;
    }
    else {
      bVar37 = slang::syntax::DataTypeSyntax::isKind(this_03->kind);
      if (!bVar37) {
        (param->targetType).type = compilation->errorType;
        this_00 = this->scope;
        local_b8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_03);
        SVar25 = parsing::Token::location((Token *)local_b8);
        pPVar36 = local_130;
        this_02 = Scope::addDiag(this_00,(DiagCode)0x60006,SVar25);
        Diagnostic::operator<<(this_02,(param->super_Symbol).name);
        goto LAB_0014d0d2;
      }
      (param->targetType).typeOrLink.typeSyntax = (DataTypeSyntax *)this_03;
    }
    puVar2 = &(param->targetType).field_0x3f;
    *puVar2 = *puVar2 & 0x7f;
  }
LAB_0014d0d2:
  Scope::insertMember(newScope,&param->super_Symbol,newScope->lastMember,false,true);
  if ((param->super_ParameterSymbolBase).isLocal == false) {
    if (this->forceInvalidValues == true) {
      (param->targetType).type = compilation->errorType;
    }
    else if (this_03 == (SyntaxNode *)0x0) {
      if ((((param->super_ParameterSymbolBase).isPort == true) &&
          ((*(int *)&(param->targetType).field_0x3c < 0 ||
           ((param->targetType).typeOrLink.typeSyntax == (DataTypeSyntax *)0x0)))) &&
         ((pPVar36->hasSyntax != false ||
          ((pPVar36->field_0).valueSyntax == (ParameterDeclarationSyntax *)0x0)))) {
        createParam(slang::ast::DefinitionSymbol::ParameterDecl_const&,slang::ast::Scope&,slang::SourceLocation)
        ::$_0::operator()((__0 *)&reportError,param);
      }
    }
    else {
      if (cVar27 == '\0') {
        pAVar32 = this->instanceContext;
        if (pAVar32 == (ASTContext *)0x0) goto LAB_0014d210;
      }
      else {
        pAVar32 = (ASTContext *)local_b8;
        local_b8._8_4_ = 0xffffffff;
        local_b8._0_8_ = this->configScope;
        local_b8._16_8_ = 0x10000000000;
        local_a0 = (undefined1  [16])0x0;
        local_90 = (undefined1  [16])0x0;
      }
      DeclaredType::forceResolveAt(&param->targetType,pAVar32);
    }
  }
LAB_0014d210:
  return &param->super_ParameterSymbolBase;
}

Assistant:

const ParameterSymbolBase& ParameterBuilder::createParam(
    const DefinitionSymbol::ParameterDecl& decl, Scope& newScope, SourceLocation instanceLoc) {

    auto reportError = [&](auto& param) {
        anyErrors = true;
        if (!suppressErrors && !param.name.empty()) {
            auto& diag = scope.addDiag(diag::ParamHasNoValue, instanceLoc);
            diag << definitionName;
            diag << param.name;
        }
    };

    auto handlePreviewNodes = [&](const SyntaxNode& syntax) {
        // Two cases where we might have enum definitions to catch
        // via the preview nodes; for parameter decl members,
        // we need to look at the parent, and for port lists we
        // should just look at the param itself.
        if (syntax.previewNode)
            newScope.addMembers(*syntax.previewNode);

        if (syntax.parent->kind == SyntaxKind::ParameterDeclarationStatement &&
            syntax.parent->previewNode) {
            newScope.addMembers(*syntax.parent->previewNode);
        }
    };

    auto& comp = scope.getCompilation();
    const ExpressionSyntax* newInitializer = nullptr;
    bool isFromConfig = false;
    if (auto it = assignments.find(decl.name); it != assignments.end())
        std::tie(newInitializer, isFromConfig) = it->second;

    if (decl.isTypeParam) {
        auto typeRestriction = ForwardTypeRestriction::None;
        if (decl.hasSyntax && decl.typeSyntax && decl.typeSyntax->typeRestriction)
            typeRestriction = SemanticFacts::getTypeRestriction(*decl.typeSyntax->typeRestriction);

        auto param = comp.emplace<TypeParameterSymbol>(newScope, decl.name, decl.location,
                                                       decl.isLocalParam, decl.isPortParam,
                                                       typeRestriction);
        param->setAttributes(scope, decl.attributes);

        if (decl.hasSyntax) {
            handlePreviewNodes(*decl.typeSyntax);
            if (decl.typeDecl && decl.typeDecl->assignment)
                param->defaultValSyntax = decl.typeDecl->assignment->type;
        }

        auto& tt = param->targetType;
        if (newInitializer) {
            // If this is a NameSyntax, the parser didn't know we were assigning to
            // a type parameter, so fix it up into a NamedTypeSyntax to get a type from it.
            tt.addFlags(DeclaredTypeFlags::TypeOverridden);
            if (NameSyntax::isKind(newInitializer->kind)) {
                // const_cast is ugly but safe here, we're only going to refer to it
                // by const reference everywhere down.
                auto& nameSyntax = const_cast<NameSyntax&>(newInitializer->as<NameSyntax>());
                auto namedType = comp.emplace<NamedTypeSyntax>(nameSyntax);

                tt.setTypeSyntax(*namedType);
            }
            else if (!DataTypeSyntax::isKind(newInitializer->kind)) {
                tt.setType(comp.getErrorType());
                scope.addDiag(diag::BadTypeParamExpr, newInitializer->getFirstToken().location())
                    << param->name;
            }
            else {
                tt.setTypeSyntax(newInitializer->as<DataTypeSyntax>());
            }
        }
        else if (!decl.hasSyntax) {
            if (decl.givenType)
                tt.setType(*decl.givenType);
            else
                tt.setType(comp.getErrorType());
        }
        else {
            SLANG_ASSERT(decl.typeDecl);
            param->setSyntax(*decl.typeDecl);
            if (decl.typeDecl->assignment)
                tt.setTypeSyntax(*decl.typeDecl->assignment->type);
            else
                tt.setType(comp.getErrorType());
        }

        newScope.addMember(*param);

        if (!param->isLocalParam()) {
            if (forceInvalidValues) {
                tt.setType(comp.getErrorType());
            }
            else if (newInitializer) {
                if (isFromConfig) {
                    SLANG_ASSERT(configScope);
                    tt.forceResolveAt(
                        ASTContext(*configScope, LookupLocation::max, ASTFlags::ConfigParam));
                }
                else if (instanceContext) {
                    tt.forceResolveAt(*instanceContext);
                }
            }
            else if (param->isPortParam() && !tt.getTypeSyntax() &&
                     (decl.hasSyntax || !decl.givenType)) {
                reportError(*param);
            }
        }

        return *param;
    }
    else {
        auto param = comp.emplace<ParameterSymbol>(decl.name, decl.location, decl.isLocalParam,
                                                   decl.isPortParam);
        param->setAttributes(scope, decl.attributes);

        if (decl.hasSyntax) {
            param->defaultValSyntax = decl.valueDecl;
            handlePreviewNodes(*decl.valueSyntax);
        }

        auto& declType = *param->getDeclaredType();
        if (newInitializer)
            declType.addFlags(DeclaredTypeFlags::InitializerOverridden);

        if (!decl.hasSyntax) {
            SLANG_ASSERT(decl.givenType);
            param->setType(*decl.givenType);
            if (decl.givenInitializer)
                param->setInitializer(*decl.givenInitializer);
        }
        else {
            SLANG_ASSERT(decl.valueSyntax);
            SLANG_ASSERT(decl.valueDecl);

            param->setDeclaredType(*decl.valueSyntax->type);
            param->setFromDeclarator(*decl.valueDecl);
        }

        if (newInitializer) {
            param->setInitializerSyntax(*newInitializer,
                                        newInitializer->getFirstToken().location());
        }

        newScope.addMember(*param);

        // If there is an override node, see if this parameter is in it.
        // Note that we ignore the override node if this is from a configuration,
        // as the LRM says config overrides take precedence over defparams.
        if (auto paramSyntax = param->getSyntax(); overrideNode && paramSyntax && !isFromConfig) {
            if (auto it = overrideNode->paramOverrides.find(paramSyntax);
                it != overrideNode->paramOverrides.end()) {
                param->setValue(comp, it->second.first, /* needsCoercion */ true);
                return *param;
            }
        }

        if (!param->isLocalParam()) {
            if (forceInvalidValues) {
                param->setValue(comp, nullptr, /* needsCoercion */ false);
            }
            else if (newInitializer) {
                if (isFromConfig) {
                    SLANG_ASSERT(configScope);
                    param->setIsFromConfig(true);
                    declType.resolveAt(
                        ASTContext(*configScope, LookupLocation::max, ASTFlags::ConfigParam));
                }
                else if (instanceContext) {
                    declType.resolveAt(*instanceContext);
                }
            }
            else if (param->isPortParam() && !declType.getInitializerSyntax()) {
                reportError(*param);
            }
        }

        return *param;
    }
}